

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonTranslateBlobToText(JsonParse *pParse,u32 i,JsonString *pOut)

{
  u8 uVar1;
  byte bVar2;
  char c;
  u32 uVar3;
  int iVar4;
  uint uVar5;
  u8 *puVar6;
  char *zFormat;
  bool bVar7;
  bool bVar8;
  uint local_70;
  int x;
  u32 sz2;
  u32 k_2;
  char *zIn_2;
  char *zIn_1;
  u32 k_1;
  int bOverflow;
  char *zIn;
  sqlite3_uint64 u;
  u32 k;
  u32 iEnd;
  u32 j;
  u32 n;
  u32 sz;
  JsonString *pOut_local;
  JsonParse *pJStack_18;
  u32 i_local;
  JsonParse *pParse_local;
  
  _n = pOut;
  pOut_local._4_4_ = i;
  pJStack_18 = pParse;
  uVar3 = jsonbPayloadSize(pParse,i,&j);
  if (uVar3 == 0) {
    _n->eErr = _n->eErr | 2;
    return pJStack_18->nBlob + 1;
  }
  switch(pJStack_18->aBlob[pOut_local._4_4_] & 0xf) {
  case 0:
    jsonAppendRawNZ(_n,"null",4);
    return pOut_local._4_4_ + 1;
  case 1:
    jsonAppendRawNZ(_n,"true",4);
    return pOut_local._4_4_ + 1;
  case 2:
    jsonAppendRawNZ(_n,"false",5);
    return pOut_local._4_4_ + 1;
  case 3:
  case 5:
    if (j != 0) {
      jsonAppendRaw(_n,(char *)(pJStack_18->aBlob + (pOut_local._4_4_ + uVar3)),j);
      break;
    }
  default:
switchD_001ea861_default:
    _n->eErr = _n->eErr | 2;
    break;
  case 4:
    u._4_4_ = 2;
    zIn = (char *)0x0;
    puVar6 = pJStack_18->aBlob + (pOut_local._4_4_ + uVar3);
    bVar7 = false;
    if (j != 0) {
      if (*puVar6 == '-') {
        jsonAppendChar(_n,'-');
        u._4_4_ = 3;
      }
      else if (*puVar6 == '+') {
        u._4_4_ = 3;
      }
      for (; u._4_4_ < j; u._4_4_ = u._4_4_ + 1) {
        if ((""[puVar6[u._4_4_]] & 8) == 0) {
          _n->eErr = _n->eErr | 2;
          break;
        }
        if ((ulong)zIn >> 0x3c == 0) {
          bVar2 = sqlite3HexToInt((int)(char)puVar6[u._4_4_]);
          zIn = (char *)((long)zIn * 0x10 + (ulong)bVar2);
        }
        else {
          bVar7 = true;
        }
      }
      zFormat = "%llu";
      if (bVar7) {
        zFormat = "9.0e999";
      }
      jsonPrintf(100,_n,zFormat,zIn);
      break;
    }
    goto switchD_001ea861_default;
  case 6:
    puVar6 = pJStack_18->aBlob + (pOut_local._4_4_ + uVar3);
    if (j != 0) {
      uVar1 = *puVar6;
      if (uVar1 == '-') {
        jsonAppendChar(_n,'-');
      }
      zIn_1._0_4_ = (uint)(uVar1 == '-');
      if (puVar6[(uint)zIn_1] == '.') {
        jsonAppendChar(_n,'0');
      }
      for (; (uint)zIn_1 < j; zIn_1._0_4_ = (uint)zIn_1 + 1) {
        jsonAppendChar(_n,puVar6[(uint)zIn_1]);
        if ((puVar6[(uint)zIn_1] == '.') &&
           (((uint)zIn_1 + 1 == j || ((""[puVar6[(uint)zIn_1 + 1]] & 4) == 0)))) {
          jsonAppendChar(_n,'0');
        }
      }
      break;
    }
    goto switchD_001ea861_default;
  case 7:
  case 8:
    jsonAppendChar(_n,'\"');
    jsonAppendRaw(_n,(char *)(pJStack_18->aBlob + (pOut_local._4_4_ + uVar3)),j);
    jsonAppendChar(_n,'\"');
    break;
  case 9:
    local_70 = j;
    _sz2 = pJStack_18->aBlob + (pOut_local._4_4_ + uVar3);
    jsonAppendChar(_n,'\"');
    while (local_70 != 0) {
      x = 0;
      while( true ) {
        bVar7 = false;
        if (((uint)x < local_70) && (bVar7 = true, ""[_sz2[(uint)x]] == '\0')) {
          bVar7 = _sz2[(uint)x] == '\'';
        }
        if (!bVar7) break;
        x = x + 1;
      }
      if (x != 0) {
        jsonAppendRawNZ(_n,(char *)_sz2,x);
        if (local_70 <= (uint)x) break;
        _sz2 = _sz2 + (uint)x;
        local_70 = local_70 - x;
      }
      if (*_sz2 == '\"') {
        jsonAppendRawNZ(_n,"\\\"",2);
        _sz2 = _sz2 + 1;
        local_70 = local_70 - 1;
      }
      else if ((char)*_sz2 < ' ') {
        if ((_n->nAlloc < _n->nUsed + 7) && (iVar4 = jsonStringGrow(_n,7), iVar4 != 0)) break;
        jsonAppendControlChar(_n,*_sz2);
        _sz2 = _sz2 + 1;
        local_70 = local_70 - 1;
      }
      else {
        if (local_70 < 2) {
          _n->eErr = _n->eErr | 2;
          break;
        }
        uVar1 = _sz2[1];
        if (uVar1 != '\n') {
          if (uVar1 == '\r') {
            if ((2 < local_70) && (_sz2[2] == '\n')) {
              _sz2 = _sz2 + 1;
              local_70 = local_70 - 1;
            }
          }
          else if (uVar1 == '\'') {
            jsonAppendChar(_n,'\'');
          }
          else if (uVar1 == '0') {
            jsonAppendRawNZ(_n,"\\u0000",6);
          }
          else if (uVar1 == 'v') {
            jsonAppendRawNZ(_n,"\\u0009",6);
          }
          else if (uVar1 == 'x') {
            if (local_70 < 4) {
              _n->eErr = _n->eErr | 2;
              local_70 = 2;
            }
            else {
              jsonAppendRawNZ(_n,"\\u00",4);
              jsonAppendRawNZ(_n,(char *)(_sz2 + 2),2);
              _sz2 = _sz2 + 2;
              local_70 = local_70 - 2;
            }
          }
          else if (uVar1 == 0xe2) {
            if (((local_70 < 4) || (_sz2[2] != 0x80)) || ((_sz2[3] != 0xa8 && (_sz2[3] != 0xa9)))) {
              _n->eErr = _n->eErr | 2;
              local_70 = 2;
            }
            else {
              _sz2 = _sz2 + 2;
              local_70 = local_70 - 2;
            }
          }
          else {
            jsonAppendRawNZ(_n,(char *)_sz2,2);
          }
        }
        _sz2 = _sz2 + 2;
        local_70 = local_70 - 2;
      }
    }
    jsonAppendChar(_n,'\"');
    break;
  case 10:
    jsonAppendString(_n,(char *)(pJStack_18->aBlob + (pOut_local._4_4_ + uVar3)),j);
    break;
  case 0xb:
    jsonAppendChar(_n,'[');
    k = pOut_local._4_4_ + uVar3;
    uVar5 = k + j;
    while( true ) {
      bVar7 = false;
      if (k < uVar5) {
        bVar7 = _n->eErr == '\0';
      }
      if (!bVar7) break;
      k = jsonTranslateBlobToText(pJStack_18,k,_n);
      jsonAppendChar(_n,',');
    }
    if (uVar5 < k) {
      _n->eErr = _n->eErr | 2;
    }
    if (j != 0) {
      jsonStringTrimOneChar(_n);
    }
    jsonAppendChar(_n,']');
    break;
  case 0xc:
    jsonAppendChar(_n,'{');
    k = pOut_local._4_4_ + uVar3;
    uVar5 = k + j;
    bVar7 = false;
    while( true ) {
      bVar8 = false;
      if (k < uVar5) {
        bVar8 = _n->eErr == '\0';
      }
      if (!bVar8) break;
      k = jsonTranslateBlobToText(pJStack_18,k,_n);
      c = ':';
      if (bVar7) {
        c = ',';
      }
      jsonAppendChar(_n,c);
      bVar7 = (bool)(bVar7 ^ 1);
    }
    if ((bVar7) || (uVar5 < k)) {
      _n->eErr = _n->eErr | 2;
    }
    if (j != 0) {
      jsonStringTrimOneChar(_n);
    }
    jsonAppendChar(_n,'}');
  }
  return pOut_local._4_4_ + uVar3 + j;
}

Assistant:

static u32 jsonTranslateBlobToText(
  const JsonParse *pParse,       /* the complete parse of the JSON */
  u32 i,                         /* Start rendering at this index */
  JsonString *pOut               /* Write JSON here */
){
  u32 sz, n, j, iEnd;

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    pOut->eErr |= JSTRING_MALFORMED;
    return pParse->nBlob+1;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      jsonAppendRawNZ(pOut, "null", 4);
      return i+1;
    }
    case JSONB_TRUE: {
      jsonAppendRawNZ(pOut, "true", 4);
      return i+1;
    }
    case JSONB_FALSE: {
      jsonAppendRawNZ(pOut, "false", 5);
      return i+1;
    }
    case JSONB_INT:
    case JSONB_FLOAT: {
      if( sz==0 ) goto malformed_jsonb;
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_INT5: {  /* Integer literal in hexadecimal notation */
      u32 k = 2;
      sqlite3_uint64 u = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      int bOverflow = 0;
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }else if( zIn[0]=='+' ){
        k++;
      }
      for(; k<sz; k++){
        if( !sqlite3Isxdigit(zIn[k]) ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }else if( (u>>60)!=0 ){
          bOverflow = 1;
        }else{
          u = u*16 + sqlite3HexToInt(zIn[k]);
        }
      }
      jsonPrintf(100,pOut,bOverflow?"9.0e999":"%llu", u);
      break;
    }
    case JSONB_FLOAT5: { /* Float literal missing digits beside "." */
      u32 k = 0;
      const char *zIn = (const char*)&pParse->aBlob[i+n];
      if( sz==0 ) goto malformed_jsonb;
      if( zIn[0]=='-' ){
        jsonAppendChar(pOut, '-');
        k++;
      }
      if( zIn[k]=='.' ){
        jsonAppendChar(pOut, '0');
      }
      for(; k<sz; k++){
        jsonAppendChar(pOut, zIn[k]);
        if( zIn[k]=='.' && (k+1==sz || !sqlite3Isdigit(zIn[k+1])) ){
          jsonAppendChar(pOut, '0');
        }
      }
      break;
    }
    case JSONB_TEXT:
    case JSONB_TEXTJ: {
      jsonAppendChar(pOut, '"');
      jsonAppendRaw(pOut, (const char*)&pParse->aBlob[i+n], sz);
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXT5: {
      const char *zIn;
      u32 k;
      u32 sz2 = sz;
      zIn = (const char*)&pParse->aBlob[i+n];
      jsonAppendChar(pOut, '"');
      while( sz2>0 ){
        for(k=0; k<sz2 && (jsonIsOk[(u8)zIn[k]] || zIn[k]=='\''); k++){}
        if( k>0 ){
          jsonAppendRawNZ(pOut, zIn, k);
          if( k>=sz2 ){
            break;
          }
          zIn += k;
          sz2 -= k;
        }
        if( zIn[0]=='"' ){
          jsonAppendRawNZ(pOut, "\\\"", 2);
          zIn++;
          sz2--;
          continue;
        }
        if( zIn[0]<=0x1f ){
          if( pOut->nUsed+7>pOut->nAlloc && jsonStringGrow(pOut,7) ) break;
          jsonAppendControlChar(pOut, zIn[0]);
          zIn++;
          sz2--;
          continue;
        }
        assert( zIn[0]=='\\' );
        assert( sz2>=1 );
        if( sz2<2 ){
          pOut->eErr |= JSTRING_MALFORMED;
          break;
        }
        switch( (u8)zIn[1] ){
          case '\'':
            jsonAppendChar(pOut, '\'');
            break;
          case 'v':
            jsonAppendRawNZ(pOut, "\\u0009", 6);
            break;
          case 'x':
            if( sz2<4 ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            jsonAppendRawNZ(pOut, "\\u00", 4);
            jsonAppendRawNZ(pOut, &zIn[2], 2);
            zIn += 2;
            sz2 -= 2;
            break;
          case '0':
            jsonAppendRawNZ(pOut, "\\u0000", 6);
            break;
          case '\r':
            if( sz2>2 && zIn[2]=='\n' ){
              zIn++;
              sz2--;
            }
            break;
          case '\n':
            break;
          case 0xe2:
            /* '\' followed by either U+2028 or U+2029 is ignored as
            ** whitespace.  Not that in UTF8, U+2028 is 0xe2 0x80 0x29.
            ** U+2029 is the same except for the last byte */
            if( sz2<4
             || 0x80!=(u8)zIn[2]
             || (0xa8!=(u8)zIn[3] && 0xa9!=(u8)zIn[3])
            ){
              pOut->eErr |= JSTRING_MALFORMED;
              sz2 = 2;
              break;
            }
            zIn += 2;
            sz2 -= 2;
            break;
          default:
            jsonAppendRawNZ(pOut, zIn, 2);
            break;
        }
        assert( sz2>=2 );
        zIn += 2;
        sz2 -= 2;
      }
      jsonAppendChar(pOut, '"');
      break;
    }
    case JSONB_TEXTRAW: {
      jsonAppendString(pOut, (const char*)&pParse->aBlob[i+n], sz);
      break;
    }
    case JSONB_ARRAY: {
      jsonAppendChar(pOut, '[');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, ',');
      }
      if( j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, ']');
      break;
    }
    case JSONB_OBJECT: {
      int x = 0;
      jsonAppendChar(pOut, '{');
      j = i+n;
      iEnd = j+sz;
      while( j<iEnd && pOut->eErr==0 ){
        j = jsonTranslateBlobToText(pParse, j, pOut);
        jsonAppendChar(pOut, (x++ & 1) ? ',' : ':');
      }
      if( (x & 1)!=0 || j>iEnd ) pOut->eErr |= JSTRING_MALFORMED;
      if( sz>0 ) jsonStringTrimOneChar(pOut);
      jsonAppendChar(pOut, '}');
      break;
    }

    default: {
      malformed_jsonb:
      pOut->eErr |= JSTRING_MALFORMED;
      break;
    }
  }
  return i+n+sz;
}